

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::values::abstract_value<bool>::abstract_value(abstract_value<bool> *this)

{
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_002410d0;
  std::make_shared<bool>();
  this->m_store = (this->m_result).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->m_default = false;
  this->m_implicit = false;
  (this->m_default_value)._M_dataplus._M_p = (pointer)&(this->m_default_value).field_2;
  (this->m_default_value)._M_string_length = 0;
  (this->m_default_value).field_2._M_local_buf[0] = '\0';
  (this->m_implicit_value)._M_dataplus._M_p = (pointer)&(this->m_implicit_value).field_2;
  (this->m_implicit_value)._M_string_length = 0;
  (this->m_implicit_value).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

abstract_value()
  : m_result(std::make_shared<T>())
  , m_store(m_result.get())
  {
  }